

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  PathPtr path_00;
  size_t in_RCX;
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar1;
  Maybe<kj::AutoCloseFd> local_44;
  Maybe<kj::Own<kj::ReadableDirectory>_> local_38;
  String *local_28;
  DiskHandle *this_local;
  PathPtr path_local;
  
  this_local = (DiskHandle *)path.parts.size_;
  local_28 = path.parts.ptr;
  path_00.parts.size_ = in_RCX;
  path_00.parts.ptr = (String *)this_local;
  path_local.parts.size_ = (size_t)this;
  tryOpenSubdirInternal(&local_44,(DiskHandle *)local_28,path_00);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::ReadableDirectory>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_38,
             (_func_Own<kj::ReadableDirectory>_AutoCloseFd *)&local_44);
  Maybe<kj::Own<const_kj::ReadableDirectory>_>::Maybe<kj::ReadableDirectory>
            ((Maybe<kj::Own<const_kj::ReadableDirectory>_> *)this,&local_38);
  Maybe<kj::Own<kj::ReadableDirectory>_>::~Maybe(&local_38);
  Maybe<kj::AutoCloseFd>::~Maybe(&local_44);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }